

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# time.cpp
# Opt level: O3

bool duckdb::Time::TryConvertInternal
               (char *buf,idx_t len,idx_t *pos,dtime_t *result,bool strict,
               optional_ptr<int,_true> nanos)

{
  byte bVar1;
  uint uVar2;
  bool bVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  int iVar7;
  idx_t iVar8;
  long lVar9;
  long lVar10;
  int iVar11;
  ulong uVar12;
  int iVar13;
  int iVar14;
  bool bVar15;
  int32_t min;
  int32_t sec;
  uint local_40;
  uint local_3c;
  optional_ptr<int,_true> local_38;
  
  local_40 = 0xffffffff;
  local_3c = 0xffffffff;
  *pos = 0;
  if (len == 0) {
    return false;
  }
  iVar8 = 1;
  while ((bVar1 = buf[iVar8 - 1], bVar1 - 9 < 5 || (bVar1 == 0x20))) {
    *pos = iVar8;
    bVar15 = iVar8 == len;
    iVar8 = iVar8 + 1;
    if (bVar15) {
      return false;
    }
  }
  iVar13 = 0;
  if (len <= iVar8 - 1 || 9 < (byte)(bVar1 - 0x30)) {
    return false;
  }
  lVar9 = 0;
  while ((byte)(buf[(iVar8 - 1) + lVar9] - 0x30U) < 10) {
    if ((int)lVar9 == 9) {
      return false;
    }
    iVar13 = (uint)(byte)buf[(iVar8 - 1) + lVar9] + iVar13 * 10 + -0x30;
    *pos = iVar8 + lVar9;
    lVar10 = lVar9 + (iVar8 - len);
    lVar9 = lVar9 + 1;
    if (lVar10 == 0) {
      return false;
    }
  }
  *pos = iVar8 + lVar9;
  if (buf[(iVar8 - 1) + lVar9] != ':') {
    return false;
  }
  bVar15 = !strict;
  local_38.ptr = nanos.ptr;
  if (iVar8 + lVar9 == len && bVar15) {
    uVar12 = 0;
    uVar5 = len;
LAB_002d62b3:
    iVar14 = 0;
    uVar4 = 0;
    if ((iVar8 - len) + lVar9 == -2 || bVar15) goto LAB_002d63fe;
  }
  else {
    bVar3 = Date::ParseDoubleDigit(buf,len,pos,(int32_t *)&local_40);
    if (0x3b < local_40 || !bVar3) {
      return false;
    }
    uVar5 = *pos;
    if (len < uVar5) {
      return false;
    }
    uVar12 = (ulong)local_40;
    if (uVar5 == len) goto LAB_002d62b3;
  }
  *pos = uVar5 + 1;
  iVar14 = 0;
  if (buf[uVar5] != ':') {
    return false;
  }
  if (uVar5 + 1 == len && bVar15) {
    uVar4 = 0;
  }
  else {
    bVar15 = Date::ParseDoubleDigit(buf,len,pos,(int32_t *)&local_3c);
    uVar2 = local_3c;
    if (0x3b < local_3c || !bVar15) {
      return false;
    }
    uVar5 = *pos;
    iVar14 = 0;
    if ((uVar5 < len) && (buf[uVar5] == '.')) {
      uVar4 = uVar5 + 1;
      *pos = uVar4;
      iVar14 = 0;
      uVar5 = uVar4;
      if (uVar4 < len) {
        iVar7 = 100000000;
        if (nanos.ptr == (int *)0x0) {
          iVar7 = 100000;
        }
        iVar14 = 0;
        do {
          uVar5 = uVar4;
          if (9 < (byte)(buf[uVar4] - 0x30U)) break;
          iVar11 = ((byte)buf[uVar4] - 0x30) * iVar7;
          if (iVar7 < 1) {
            iVar11 = 0;
          }
          iVar14 = iVar14 + iVar11;
          uVar4 = uVar4 + 1;
          *pos = uVar4;
          iVar7 = iVar7 / 10;
          uVar5 = len;
        } while (len != uVar4);
      }
      if (nanos.ptr != (int *)0x0) {
        optional_ptr<int,_true>::CheckValid(&local_38);
        *local_38.ptr = iVar14 % 1000;
        uVar5 = *pos;
        iVar14 = iVar14 / 1000;
      }
    }
    uVar4 = (ulong)uVar2;
    if (strict && uVar5 < len) {
      do {
        uVar6 = uVar5 + 1;
        if ((4 < (byte)buf[uVar5] - 9) && (buf[uVar5] != 0x20)) {
          return false;
        }
        *pos = uVar6;
        uVar5 = uVar6;
      } while (uVar6 != len);
    }
  }
LAB_002d63fe:
  result->micros = (long)iVar14 + (((long)iVar13 * 0x3c + uVar12) * 0x3c + uVar4) * 1000000;
  return true;
}

Assistant:

bool Time::TryConvertInternal(const char *buf, idx_t len, idx_t &pos, dtime_t &result, bool strict,
                              optional_ptr<int32_t> nanos) {
	int32_t hour = -1, min = -1, sec = -1, micros = -1;
	pos = 0;

	if (len == 0) {
		return false;
	}

	int sep;

	// skip leading spaces
	while (pos < len && StringUtil::CharacterIsSpace(buf[pos])) {
		pos++;
	}

	if (pos >= len) {
		return false;
	}

	if (!StringUtil::CharacterIsDigit(buf[pos])) {
		return false;
	}

	// Allow up to 9 digit hours to support intervals
	hour = 0;
	for (int32_t digits = 9; pos < len && StringUtil::CharacterIsDigit(buf[pos]); ++pos) {
		if (digits-- > 0) {
			hour = hour * 10 + (buf[pos] - '0');
		} else {
			return false;
		}
	}

	if (pos >= len) {
		return false;
	}

	// fetch the separator
	sep = buf[pos++];
	if (sep != ':') {
		// invalid separator
		return false;
	}
	idx_t sep_pos = pos;
	if (pos == len && !strict) {
		min = 0;
	} else {
		if (!Date::ParseDoubleDigit(buf, len, pos, min)) {
			return false;
		}
		if (min < 0 || min >= 60) {
			return false;
		}
	}

	if (pos > len) {
		return false;
	}
	if (pos == len && (!strict || sep_pos + 2 == pos)) {
		sec = 0;
	} else {
		if (buf[pos++] != sep) {
			return false;
		}

		if (pos == len && !strict) {
			sec = 0;
		} else {
			if (!Date::ParseDoubleDigit(buf, len, pos, sec)) {
				return false;
			}
			if (sec < 0 || sec >= 60) {
				return false;
			}
		}
	}

	micros = 0;
	if (pos < len && buf[pos] == '.') {
		pos++;
		// we expect some microseconds
		int32_t mult = 100000;
		if (nanos) {
			// do we expect nanoseconds?
			mult *= Interval::NANOS_PER_MICRO;
		}
		for (; pos < len && StringUtil::CharacterIsDigit(buf[pos]); pos++, mult /= 10) {
			if (mult > 0) {
				micros += (buf[pos] - '0') * mult;
			}
		}
		if (nanos) {
			*nanos = UnsafeNumericCast<int32_t>(micros % Interval::NANOS_PER_MICRO);
			micros /= Interval::NANOS_PER_MICRO;
		}
	}

	// in strict mode, check remaining string for non-space characters
	if (strict) {
		// skip trailing spaces
		while (pos < len && StringUtil::CharacterIsSpace(buf[pos])) {
			pos++;
		}
		// check position. if end was not reached, non-space chars remaining
		if (pos < len) {
			return false;
		}
	}

	result = Time::FromTime(hour, min, sec, micros);
	return true;
}